

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

PSNodesBlock * __thiscall
dg::pta::LLVMPointerGraphBuilder::buildPointerGraphBlock
          (PSNodesBlock *__return_storage_ptr__,LLVMPointerGraphBuilder *this,BasicBlock *block,
          PointerSubgraph *parent)

{
  BasicBlock *pBVar1;
  pointer ppPVar2;
  bool bVar3;
  PSNodesSeq *__range3;
  PSNodesSeq *s;
  pointer ppPVar4;
  BasicBlock *Inst;
  
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_nodes).
  super__Vector_base<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*,_std::allocator<dg::pta::LLVMPointerGraphBuilder::PSNodesSeq_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pBVar1 = *(BasicBlock **)(block + 0x30); pBVar1 != block + 0x28;
      pBVar1 = *(BasicBlock **)(pBVar1 + 8)) {
    Inst = pBVar1 + -0x18;
    if (pBVar1 == (BasicBlock *)0x0) {
      Inst = (BasicBlock *)0x0;
    }
    bVar3 = isRelevantInstruction(this,(Instruction *)Inst);
    if (bVar3) {
      s = buildInstruction(this,(Instruction *)Inst);
      ppPVar2 = (s->_nodes).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppPVar4 = (s->_nodes).
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppPVar4 != ppPVar2;
          ppPVar4 = ppPVar4 + 1) {
        (*ppPVar4)->_parent = parent;
      }
      PSNodesBlock::append(__return_storage_ptr__,s);
    }
    else if (((((CallInst *)Inst)[0x10] == (CallInst)0x53) &&
             (bVar3 = llvm::IntrinsicInst::classof((CallInst *)Inst), bVar3)) &&
            (*(int *)(*(long *)((CallInst *)Inst + -0x20) + 0x24) == 0xc4)) {
      checkMemSet(this,(Instruction *)Inst);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesBlock
LLVMPointerGraphBuilder::buildPointerGraphBlock(const llvm::BasicBlock &block,
                                                PointerSubgraph *parent) {
    PSNodesBlock blk;

    for (const llvm::Instruction &Inst : block) {
        if (!isRelevantInstruction(Inst)) {
            // check if it is a zeroing of memory,
            // if so, set the corresponding memory to zeroed
            if (llvm::isa<llvm::MemSetInst>(&Inst))
                checkMemSet(&Inst);

            continue;
        }

        assert(nodes_map.count(&Inst) == 0 && "Already built this instruction");
        auto &seq = buildInstruction(Inst);

        // set parent to the new nodes
        for (auto *nd : seq) {
            nd->setParent(parent);
        }

        blk.append(&seq);
    }

    return blk;
}